

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O0

bool operator<(CExtPubKey *a,CExtPubKey *b)

{
  bool bVar1;
  base_blob<256U> *in_RSI;
  base_blob<256U> *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  CPubKey *a_00;
  
  a_00 = *(CPubKey **)(in_FS_OFFSET + 0x28);
  bVar1 = operator<(a_00,(CPubKey *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  if (bVar1) {
    bVar1 = true;
  }
  else {
    bVar1 = operator>(a_00,(CPubKey *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0))
    ;
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = operator<(in_RDI,in_RSI);
    }
  }
  if (*(CPubKey **)(in_FS_OFFSET + 0x28) == a_00) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const CExtPubKey &a, const CExtPubKey &b)
    {
        if (a.pubkey < b.pubkey) {
            return true;
        } else if (a.pubkey > b.pubkey) {
            return false;
        }
        return a.chaincode < b.chaincode;
    }